

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O3

ON_2dPoint __thiscall ON_SubDFaceParameter::QuadFaceParameters(ON_SubDFaceParameter *this)

{
  double dVar1;
  ushort uVar2;
  ushort uVar3;
  ON_2dPoint OVar4;
  double dVar5;
  ON_2dPoint OVar6;
  
  uVar2 = (this->m_cdex).m_corner_index;
  uVar3 = (this->m_cdex).m_edge_count;
  if (((2 < uVar3 && uVar2 < uVar3) && (0.0 <= this->m_s)) && (this->m_s <= 0.5)) {
    dVar1 = this->m_t;
    dVar5 = (double)-(ulong)(0.5 < dVar1);
    if (uVar3 == 4 && (0.0 <= dVar1 && 0.5 >= dVar1)) {
      OVar6.x = (double)(*(code *)(&DAT_006d2afc + *(int *)(&DAT_006d2afc + (ulong)uVar2 * 4)))();
      OVar6.y = dVar5;
      return OVar6;
    }
  }
  OVar4.y = ON_2dPoint::NanPoint.y;
  OVar4.x = ON_2dPoint::NanPoint.x;
  return OVar4;
}

Assistant:

const ON_2dPoint ON_SubDFaceParameter::QuadFaceParameters() const
{
  if (IsSet() && m_cdex.IsQuadFace())
  {
    switch (m_cdex.CornerIndex())
    {
    case 0:
      return ON_2dPoint(m_s, m_t);
      break;
    case 1:
      return ON_2dPoint(1.0 - m_t, m_s);
      break;
    case 2:
      return ON_2dPoint(1.0 - m_s, 1.0 - m_t);
      break;
    case 3:
      return ON_2dPoint(m_t, 1.0 - m_s);
      break;
    }
  }
  return ON_2dPoint::NanPoint;
}